

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void DivisionHelper<unsigned_short,_short,_1>::
     DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,short *u,unsigned_short *result)

{
  uint32_t uVar1;
  undefined2 *in_RDX;
  short *in_RSI;
  ushort *in_RDI;
  
  if (*in_RSI == 0) {
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnDivZero();
  }
  if (*in_RDI == 0) {
    *in_RDX = 0;
  }
  else if (*in_RSI < 1) {
    uVar1 = AbsValueHelper<short,_0>::Abs(0);
    if (uVar1 <= *in_RDI) {
      safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
    }
    *in_RDX = 0;
  }
  else {
    *in_RDX = (short)((long)(ulong)*in_RDI / (long)(int)*in_RSI);
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void DivideThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {

        if( u == 0 )
            E::SafeIntOnDivZero();

        if( t == 0 )
        {
            result = 0;
            return;
        }

        if( u > 0 )
        {
            result = (T)( t/u );
            return;
        }

        // it is always an error to try and divide an unsigned number by a negative signed number
        // unless u is bigger than t
        if( AbsValueHelper< U, GetAbsMethod< U >::method >::Abs( u ) > t )
        {
            result = 0;
            return;
        }

        E::SafeIntOnOverflow();
    }